

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.h
# Opt level: O3

ParseableFunctionInfo * __thiscall Js::FunctionProxy::GetParseableFunctionInfo(FunctionProxy *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  FunctionInfo *pFVar4;
  
  pFVar4 = (this->functionInfo).ptr;
  if (pFVar4 == (FunctionInfo *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x530,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar2) goto LAB_004be562;
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
  }
  if ((pFVar4->functionBodyImpl).ptr != this) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x531,"(GetFunctionInfo()->GetFunctionProxy() == this)",
                                "GetFunctionInfo()->GetFunctionProxy() == this");
    if (!bVar2) goto LAB_004be562;
    *puVar3 = 0;
    pFVar4 = (this->functionInfo).ptr;
  }
  if ((pFVar4->attributes & DeferredDeserialize) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Base/FunctionBody.h"
                                ,0x592,"(!IsDeferredDeserializeFunction())",
                                "!IsDeferredDeserializeFunction()");
    if (!bVar2) {
LAB_004be562:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return (ParseableFunctionInfo *)this;
}

Assistant:

inline ParseableFunctionInfo* FunctionProxy::GetParseableFunctionInfo() const
    {
        Assert(!IsDeferredDeserializeFunction());
        return (ParseableFunctionInfo*)this;
    }